

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

int al_ustr_offset(ALLEGRO_USTR *us,int index)

{
  _Bool _Var1;
  size_t sVar2;
  int iVar3;
  int pos;
  int local_1c;
  
  local_1c = 0;
  if (index < 0) {
    sVar2 = al_ustr_length(us);
    index = (int)sVar2 + index;
  }
  iVar3 = index + 1;
  do {
    iVar3 = iVar3 + -1;
    if (iVar3 < 1) {
      return local_1c;
    }
    _Var1 = al_ustr_next(us,&local_1c);
  } while (_Var1);
  return local_1c;
}

Assistant:

int al_ustr_offset(const ALLEGRO_USTR *us, int index)
{
   int pos = 0;

   if (index < 0)
      index += al_ustr_length(us);

   while (index-- > 0) {
      if (!al_ustr_next(us, &pos))
         return pos;
   }

   return pos;
}